

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmGraphicsShaderTestUtil.cpp
# Opt level: O3

void vkt::SpirVAssembly::createTestsForAllStages
               (string *name,RGBA (*inputColors) [4],RGBA (*outputColors) [4],
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *testCodeFragments,vector<int,_std::allocator<int>_> *specConstants,
               TestCaseGroup *tests,qpTestResult failResult,string *failMessageTemplate)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  long *plVar4;
  TestCaseGroup *group;
  mapped_type *pmVar5;
  long lVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  qpTestResult failResult_00;
  string *in_stack_fffffffffffff7b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_820;
  StageToSpecConstantMap specConstantMap;
  string local_7b0;
  string local_790;
  string local_770;
  TestCaseGroup *local_750;
  string local_748;
  ShaderElement geomPipelineStages [3];
  ShaderElement tessPipelineStages [4];
  ShaderElement vertFragPipelineStages [2];
  InstanceContext local_490;
  InstanceContext local_3b0;
  InstanceContext local_2d0;
  InstanceContext local_1f0;
  InstanceContext local_110;
  
  paVar2 = &tessPipelineStages[0].moduleName.field_2;
  tessPipelineStages[0].moduleName._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)tessPipelineStages,"vert","");
  geomPipelineStages[0].moduleName._M_dataplus._M_p =
       (pointer)&geomPipelineStages[0].moduleName.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)geomPipelineStages,"main","");
  ShaderElement::ShaderElement
            (vertFragPipelineStages,&tessPipelineStages[0].moduleName,
             &geomPipelineStages[0].moduleName,VK_SHADER_STAGE_VERTEX_BIT);
  specConstantMap._M_t._M_impl._0_8_ =
       &specConstantMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::__cxx11::string::_M_construct<char_const*>((string *)&specConstantMap,"frag","");
  paVar7 = &__str.field_2;
  __str._M_dataplus._M_p = (pointer)paVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)&__str,"main","");
  ShaderElement::ShaderElement
            (vertFragPipelineStages + 1,(string *)&specConstantMap,&__str,
             VK_SHADER_STAGE_FRAGMENT_BIT);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != paVar7) {
    operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
  }
  if ((_Base_ptr *)specConstantMap._M_t._M_impl._0_8_ !=
      &specConstantMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)specConstantMap._M_t._M_impl._0_8_,
                    (ulong)((long)&(specConstantMap._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)geomPipelineStages[0].moduleName._M_dataplus._M_p !=
      &geomPipelineStages[0].moduleName.field_2) {
    operator_delete(geomPipelineStages[0].moduleName._M_dataplus._M_p,
                    geomPipelineStages[0].moduleName.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tessPipelineStages[0].moduleName._M_dataplus._M_p != paVar2) {
    operator_delete(tessPipelineStages[0].moduleName._M_dataplus._M_p,
                    tessPipelineStages[0].moduleName.field_2._M_allocated_capacity + 1);
  }
  geomPipelineStages[0].moduleName._M_dataplus._M_p =
       (pointer)&geomPipelineStages[0].moduleName.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)geomPipelineStages,"vert","");
  specConstantMap._M_t._M_impl._0_8_ =
       &specConstantMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::__cxx11::string::_M_construct<char_const*>((string *)&specConstantMap,"main","");
  ShaderElement::ShaderElement
            (tessPipelineStages,&geomPipelineStages[0].moduleName,(string *)&specConstantMap,
             VK_SHADER_STAGE_VERTEX_BIT);
  __str._M_dataplus._M_p = (pointer)paVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)&__str,"tessc","");
  local_820._M_dataplus._M_p = (pointer)&local_820.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_820,"main","");
  ShaderElement::ShaderElement
            (tessPipelineStages + 1,&__str,&local_820,VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT);
  local_7b0._M_dataplus._M_p = (pointer)&local_7b0.field_2;
  local_750 = tests;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b0,"tesse","");
  paVar7 = &local_770.field_2;
  local_770._M_dataplus._M_p = (pointer)paVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_770,"main","");
  ShaderElement::ShaderElement
            (tessPipelineStages + 2,&local_7b0,&local_770,
             VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT);
  paVar2 = &local_790.field_2;
  local_790._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"frag","");
  local_748._M_dataplus._M_p = (pointer)&local_748.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_748,"main","");
  ShaderElement::ShaderElement
            (tessPipelineStages + 3,&local_790,&local_748,VK_SHADER_STAGE_FRAGMENT_BIT);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748._M_dataplus._M_p != &local_748.field_2) {
    operator_delete(local_748._M_dataplus._M_p,local_748.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &__str.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790._M_dataplus._M_p != paVar2) {
    operator_delete(local_790._M_dataplus._M_p,local_790.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_770._M_dataplus._M_p != paVar7) {
    operator_delete(local_770._M_dataplus._M_p,local_770.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b0._M_dataplus._M_p != &local_7b0.field_2) {
    operator_delete(local_7b0._M_dataplus._M_p,local_7b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_820._M_dataplus._M_p != &local_820.field_2) {
    operator_delete(local_820._M_dataplus._M_p,local_820.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != paVar1) {
    operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
  }
  if ((_Base_ptr *)specConstantMap._M_t._M_impl._0_8_ !=
      &specConstantMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)specConstantMap._M_t._M_impl._0_8_,
                    (ulong)((long)&(specConstantMap._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)geomPipelineStages[0].moduleName._M_dataplus._M_p !=
      &geomPipelineStages[0].moduleName.field_2) {
    operator_delete(geomPipelineStages[0].moduleName._M_dataplus._M_p,
                    geomPipelineStages[0].moduleName.field_2._M_allocated_capacity + 1);
  }
  specConstantMap._M_t._M_impl._0_8_ =
       &specConstantMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::__cxx11::string::_M_construct<char_const*>((string *)&specConstantMap,"vert","");
  __str._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&__str,"main","");
  ShaderElement::ShaderElement
            (geomPipelineStages,(string *)&specConstantMap,&__str,VK_SHADER_STAGE_VERTEX_BIT);
  local_820._M_dataplus._M_p = (pointer)&local_820.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_820,"geom","");
  local_7b0._M_dataplus._M_p = (pointer)&local_7b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b0,"main","");
  ShaderElement::ShaderElement
            (geomPipelineStages + 1,&local_820,&local_7b0,VK_SHADER_STAGE_GEOMETRY_BIT);
  local_770._M_dataplus._M_p = (pointer)paVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_770,"frag","");
  local_790._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"main","");
  ShaderElement::ShaderElement
            (geomPipelineStages + 2,&local_770,&local_790,VK_SHADER_STAGE_FRAGMENT_BIT);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790._M_dataplus._M_p != paVar2) {
    operator_delete(local_790._M_dataplus._M_p,local_790.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_820.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_770._M_dataplus._M_p != paVar7) {
    operator_delete(local_770._M_dataplus._M_p,local_770.field_2._M_allocated_capacity + 1);
  }
  group = local_750;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b0._M_dataplus._M_p != &local_7b0.field_2) {
    operator_delete(local_7b0._M_dataplus._M_p,local_7b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_820._M_dataplus._M_p != paVar2) {
    operator_delete(local_820._M_dataplus._M_p,local_820.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != paVar1) {
    operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
  }
  if ((_Base_ptr *)specConstantMap._M_t._M_impl._0_8_ !=
      &specConstantMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)specConstantMap._M_t._M_impl._0_8_,
                    (ulong)((long)&(specConstantMap._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  specConstantMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &specConstantMap._M_t._M_impl.super__Rb_tree_header._M_header;
  specConstantMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  specConstantMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  specConstantMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  __str._M_dataplus._M_p._0_4_ = 1;
  specConstantMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       specConstantMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pmVar5 = std::
           map<vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
           ::operator[](&specConstantMap,(key_type *)&__str);
  std::vector<int,_std::allocator<int>_>::operator=(pmVar5,specConstants);
  pcVar3 = (name->_M_dataplus)._M_p;
  __str._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&__str,pcVar3,pcVar3 + name->_M_string_length)
  ;
  std::__cxx11::string::append((char *)&__str);
  local_820._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_820,"");
  failResult_00 = (qpTestResult)failMessageTemplate;
  createInstanceContext<2ul>
            (&local_110,(SpirVAssembly *)vertFragPipelineStages,(ShaderElement (*) [2])inputColors,
             outputColors,(RGBA (*) [4])testCodeFragments,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&specConstantMap,(StageToSpecConstantMap *)(ulong)failResult,failResult_00,
             in_stack_fffffffffffff7b8);
  addFunctionCaseWithPrograms<vkt::SpirVAssembly::InstanceContext>
            (group,&__str,&local_820,addShaderCodeCustomVertex,runAndVerifyDefaultPipeline,
             &local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.failMessageTemplate._M_dataplus._M_p != &local_110.failMessageTemplate.field_2) {
    operator_delete(local_110.failMessageTemplate._M_dataplus._M_p,
                    local_110.failMessageTemplate.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&local_110.specConstants._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_110.testCodeFragments._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>_>
               *)&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_820._M_dataplus._M_p != paVar2) {
    operator_delete(local_820._M_dataplus._M_p,local_820.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != paVar1) {
    operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::clear(&specConstantMap._M_t);
  __str._M_dataplus._M_p._0_4_ = 2;
  pmVar5 = std::
           map<vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
           ::operator[]((map<vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
                         *)&specConstantMap._M_t,(key_type *)&__str);
  std::vector<int,_std::allocator<int>_>::operator=(pmVar5,specConstants);
  pcVar3 = (name->_M_dataplus)._M_p;
  __str._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&__str,pcVar3,pcVar3 + name->_M_string_length)
  ;
  std::__cxx11::string::append((char *)&__str);
  local_820._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_820,"");
  createInstanceContext<4ul>
            (&local_1f0,(SpirVAssembly *)tessPipelineStages,(ShaderElement (*) [4])inputColors,
             outputColors,(RGBA (*) [4])testCodeFragments,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&specConstantMap,(StageToSpecConstantMap *)(ulong)failResult,failResult_00,
             in_stack_fffffffffffff7b8);
  addFunctionCaseWithPrograms<vkt::SpirVAssembly::InstanceContext>
            (group,&__str,&local_820,addShaderCodeCustomTessControl,runAndVerifyDefaultPipeline,
             &local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0.failMessageTemplate._M_dataplus._M_p != &local_1f0.failMessageTemplate.field_2) {
    operator_delete(local_1f0.failMessageTemplate._M_dataplus._M_p,
                    local_1f0.failMessageTemplate.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&local_1f0.specConstants._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_1f0.testCodeFragments._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>_>
               *)&local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_820._M_dataplus._M_p != paVar2) {
    operator_delete(local_820._M_dataplus._M_p,local_820.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != paVar1) {
    operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::clear(&specConstantMap._M_t);
  __str._M_dataplus._M_p._0_4_ = 4;
  pmVar5 = std::
           map<vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
           ::operator[]((map<vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
                         *)&specConstantMap._M_t,(key_type *)&__str);
  std::vector<int,_std::allocator<int>_>::operator=(pmVar5,specConstants);
  pcVar3 = (name->_M_dataplus)._M_p;
  __str._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&__str,pcVar3,pcVar3 + name->_M_string_length)
  ;
  std::__cxx11::string::append((char *)&__str);
  local_820._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_820,"");
  createInstanceContext<4ul>
            (&local_2d0,(SpirVAssembly *)tessPipelineStages,(ShaderElement (*) [4])inputColors,
             outputColors,(RGBA (*) [4])testCodeFragments,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&specConstantMap,(StageToSpecConstantMap *)(ulong)failResult,failResult_00,
             in_stack_fffffffffffff7b8);
  addFunctionCaseWithPrograms<vkt::SpirVAssembly::InstanceContext>
            (group,&__str,&local_820,addShaderCodeCustomTessEval,runAndVerifyDefaultPipeline,
             &local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0.failMessageTemplate._M_dataplus._M_p != &local_2d0.failMessageTemplate.field_2) {
    operator_delete(local_2d0.failMessageTemplate._M_dataplus._M_p,
                    local_2d0.failMessageTemplate.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&local_2d0.specConstants._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_2d0.testCodeFragments._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>_>
               *)&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_820._M_dataplus._M_p != paVar2) {
    operator_delete(local_820._M_dataplus._M_p,local_820.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != paVar1) {
    operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::clear(&specConstantMap._M_t);
  __str._M_dataplus._M_p._0_4_ = 8;
  pmVar5 = std::
           map<vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
           ::operator[]((map<vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
                         *)&specConstantMap._M_t,(key_type *)&__str);
  std::vector<int,_std::allocator<int>_>::operator=(pmVar5,specConstants);
  pcVar3 = (name->_M_dataplus)._M_p;
  __str._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&__str,pcVar3,pcVar3 + name->_M_string_length)
  ;
  std::__cxx11::string::append((char *)&__str);
  local_820._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_820,"");
  createInstanceContext<3ul>
            (&local_3b0,(SpirVAssembly *)geomPipelineStages,(ShaderElement (*) [3])inputColors,
             outputColors,(RGBA (*) [4])testCodeFragments,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&specConstantMap,(StageToSpecConstantMap *)(ulong)failResult,failResult_00,
             in_stack_fffffffffffff7b8);
  addFunctionCaseWithPrograms<vkt::SpirVAssembly::InstanceContext>
            (group,&__str,&local_820,addShaderCodeCustomGeometry,runAndVerifyDefaultPipeline,
             &local_3b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0.failMessageTemplate._M_dataplus._M_p != &local_3b0.failMessageTemplate.field_2) {
    operator_delete(local_3b0.failMessageTemplate._M_dataplus._M_p,
                    local_3b0.failMessageTemplate.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&local_3b0.specConstants._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_3b0.testCodeFragments._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>_>
               *)&local_3b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_820._M_dataplus._M_p != paVar2) {
    operator_delete(local_820._M_dataplus._M_p,local_820.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != paVar1) {
    operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::clear(&specConstantMap._M_t);
  __str._M_dataplus._M_p._0_4_ = 0x10;
  pmVar5 = std::
           map<vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
           ::operator[]((map<vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
                         *)&specConstantMap._M_t,(key_type *)&__str);
  std::vector<int,_std::allocator<int>_>::operator=(pmVar5,specConstants);
  pcVar3 = (name->_M_dataplus)._M_p;
  __str._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&__str,pcVar3,pcVar3 + name->_M_string_length)
  ;
  std::__cxx11::string::append((char *)&__str);
  local_820._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_820,"");
  createInstanceContext<2ul>
            (&local_490,(SpirVAssembly *)vertFragPipelineStages,(ShaderElement (*) [2])inputColors,
             outputColors,(RGBA (*) [4])testCodeFragments,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&specConstantMap,(StageToSpecConstantMap *)(ulong)failResult,failResult_00,
             in_stack_fffffffffffff7b8);
  addFunctionCaseWithPrograms<vkt::SpirVAssembly::InstanceContext>
            (group,&__str,&local_820,addShaderCodeCustomFragment,runAndVerifyDefaultPipeline,
             &local_490);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490.failMessageTemplate._M_dataplus._M_p != &local_490.failMessageTemplate.field_2) {
    operator_delete(local_490.failMessageTemplate._M_dataplus._M_p,
                    local_490.failMessageTemplate.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&local_490.specConstants._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_490.testCodeFragments._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>_>
               *)&local_490);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_820._M_dataplus._M_p != paVar2) {
    operator_delete(local_820._M_dataplus._M_p,local_820.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != paVar1) {
    operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&specConstantMap._M_t);
  lVar6 = -0xd8;
  paVar7 = &geomPipelineStages[2].entryName.field_2;
  do {
    plVar4 = (long *)(((string *)(paVar7 + -1))->_M_dataplus)._M_p;
    if (paVar7 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar4) {
      operator_delete(plVar4,paVar7->_M_allocated_capacity + 1);
    }
    if (paVar7 + -2 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)paVar7[-3]._M_allocated_capacity) {
      operator_delete((long *)paVar7[-3]._M_allocated_capacity,paVar7[-2]._M_allocated_capacity + 1)
      ;
    }
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((long)paVar7 + -0x48);
    lVar6 = lVar6 + 0x48;
  } while (lVar6 != 0);
  lVar6 = -0x120;
  paVar7 = &tessPipelineStages[3].entryName.field_2;
  do {
    plVar4 = (long *)(((string *)(paVar7 + -1))->_M_dataplus)._M_p;
    if (paVar7 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar4) {
      operator_delete(plVar4,paVar7->_M_allocated_capacity + 1);
    }
    if (paVar7 + -2 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)paVar7[-3]._M_allocated_capacity) {
      operator_delete((long *)paVar7[-3]._M_allocated_capacity,paVar7[-2]._M_allocated_capacity + 1)
      ;
    }
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((long)paVar7 + -0x48);
    lVar6 = lVar6 + 0x48;
  } while (lVar6 != 0);
  lVar6 = -0x90;
  paVar7 = &vertFragPipelineStages[1].entryName.field_2;
  do {
    plVar4 = (long *)(((string *)(paVar7 + -1))->_M_dataplus)._M_p;
    if (paVar7 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar4) {
      operator_delete(plVar4,paVar7->_M_allocated_capacity + 1);
    }
    if (paVar7 + -2 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)paVar7[-3]._M_allocated_capacity) {
      operator_delete((long *)paVar7[-3]._M_allocated_capacity,paVar7[-2]._M_allocated_capacity + 1)
      ;
    }
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((long)paVar7 + -0x48);
    lVar6 = lVar6 + 0x48;
  } while (lVar6 != 0);
  return;
}

Assistant:

void createTestsForAllStages (const std::string&			name,
							  const RGBA					(&inputColors)[4],
							  const RGBA					(&outputColors)[4],
							  const map<string, string>&	testCodeFragments,
							  const vector<deInt32>&		specConstants,
							  tcu::TestCaseGroup*			tests,
							  const qpTestResult			failResult,
							  const string&					failMessageTemplate)
{
	const ShaderElement		vertFragPipelineStages[]		=
	{
		ShaderElement("vert", "main", VK_SHADER_STAGE_VERTEX_BIT),
		ShaderElement("frag", "main", VK_SHADER_STAGE_FRAGMENT_BIT),
	};

	const ShaderElement		tessPipelineStages[]			=
	{
		ShaderElement("vert", "main", VK_SHADER_STAGE_VERTEX_BIT),
		ShaderElement("tessc", "main", VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT),
		ShaderElement("tesse", "main", VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT),
		ShaderElement("frag", "main", VK_SHADER_STAGE_FRAGMENT_BIT),
	};

	const ShaderElement		geomPipelineStages[]				=
	{
		ShaderElement("vert", "main", VK_SHADER_STAGE_VERTEX_BIT),
		ShaderElement("geom", "main", VK_SHADER_STAGE_GEOMETRY_BIT),
		ShaderElement("frag", "main", VK_SHADER_STAGE_FRAGMENT_BIT),
	};

	StageToSpecConstantMap	specConstantMap;

	specConstantMap[VK_SHADER_STAGE_VERTEX_BIT] = specConstants;
	addFunctionCaseWithPrograms<InstanceContext>(tests, name + "_vert", "", addShaderCodeCustomVertex, runAndVerifyDefaultPipeline,
												 createInstanceContext(vertFragPipelineStages, inputColors, outputColors, testCodeFragments, specConstantMap, failResult, failMessageTemplate));

	specConstantMap.clear();
	specConstantMap[VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT] = specConstants;
	addFunctionCaseWithPrograms<InstanceContext>(tests, name + "_tessc", "", addShaderCodeCustomTessControl, runAndVerifyDefaultPipeline,
												 createInstanceContext(tessPipelineStages, inputColors, outputColors, testCodeFragments, specConstantMap, failResult, failMessageTemplate));

	specConstantMap.clear();
	specConstantMap[VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT] = specConstants;
	addFunctionCaseWithPrograms<InstanceContext>(tests, name + "_tesse", "", addShaderCodeCustomTessEval, runAndVerifyDefaultPipeline,
												 createInstanceContext(tessPipelineStages, inputColors, outputColors, testCodeFragments, specConstantMap, failResult, failMessageTemplate));

	specConstantMap.clear();
	specConstantMap[VK_SHADER_STAGE_GEOMETRY_BIT] = specConstants;
	addFunctionCaseWithPrograms<InstanceContext>(tests, name + "_geom", "", addShaderCodeCustomGeometry, runAndVerifyDefaultPipeline,
												 createInstanceContext(geomPipelineStages, inputColors, outputColors, testCodeFragments, specConstantMap, failResult, failMessageTemplate));

	specConstantMap.clear();
	specConstantMap[VK_SHADER_STAGE_FRAGMENT_BIT] = specConstants;
	addFunctionCaseWithPrograms<InstanceContext>(tests, name + "_frag", "", addShaderCodeCustomFragment, runAndVerifyDefaultPipeline,
												 createInstanceContext(vertFragPipelineStages, inputColors, outputColors, testCodeFragments, specConstantMap, failResult, failMessageTemplate));
}